

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> *node)

{
  undefined8 *puVar1;
  _Head_base<0UL,_verilogAST::File_*,_false> _Var2;
  long *in_RDX;
  undefined8 *puVar3;
  pointer *__ptr;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  new_modules;
  long *local_68;
  _Head_base<0UL,_verilogAST::AbstractModule_*,_false> local_60;
  long *local_58;
  _Head_base<0UL,_verilogAST::File_*,_false> local_50;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = *(undefined8 **)(*in_RDX + 0x10);
  local_58 = in_RDX;
  local_50._M_head_impl = (File *)this;
  for (puVar3 = *(undefined8 **)(*in_RDX + 8); puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_68 = (long *)*puVar3;
    *puVar3 = 0;
    (**(code **)&(node->_M_t).
                 super___uniq_ptr_impl<verilogAST::File,_std::default_delete<verilogAST::File>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_verilogAST::File_*,_std::default_delete<verilogAST::File>_>.
                 super__Head_base<0UL,_verilogAST::File_*,_false>._M_head_impl[10].modules.
                 super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                 ._M_impl)(&local_60,node,&local_68);
    std::
    vector<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>,std::allocator<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>>
    ::
    emplace_back<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>
              ((vector<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>,std::allocator<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>>
                *)&local_48,
               (unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                *)&local_60);
    if (local_60._M_head_impl != (AbstractModule *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 0x10))();
    }
    local_60._M_head_impl = (AbstractModule *)0x0;
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 0x10))();
    }
    local_68 = (long *)0x0;
  }
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::_M_move_assign((vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                    *)(*local_58 + 8),&local_48);
  _Var2._M_head_impl = local_50._M_head_impl;
  ((local_50._M_head_impl)->super_Node)._vptr_Node = (_func_int **)*local_58;
  *local_58 = 0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::~vector(&local_48);
  return (__uniq_ptr_data<verilogAST::File,_std::default_delete<verilogAST::File>,_true,_true>)
         (__uniq_ptr_data<verilogAST::File,_std::default_delete<verilogAST::File>,_true,_true>)
         _Var2._M_head_impl;
}

Assistant:

std::unique_ptr<File> Transformer::visit(std::unique_ptr<File> node) {
  std::vector<std::unique_ptr<AbstractModule>> new_modules;
  for (auto&& item : node->modules) {
    new_modules.push_back(this->visit(std::move(item)));
  }
  node->modules = std::move(new_modules);
  return node;
}